

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall kj::str<short&>(String *__return_storage_ptr__,kj *this,short *params)

{
  size_t size;
  String *result;
  char *__dest;
  CappedArray<char,_8UL> CVar1;
  char local_18 [8];
  
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,*(short *)this);
  local_18 = CVar1.content;
  size = CVar1.currentSize;
  heapString(__return_storage_ptr__,size);
  if (size != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,local_18,size);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}